

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaParserCtxtPtr xmlSchemaNewDocParserCtxt(xmlDocPtr doc)

{
  xmlDictPtr pxVar1;
  xmlSchemaParserCtxtPtr ret;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)xmlSchemaParserCtxtCreate();
    if ((xmlSchemaParserCtxtPtr)doc_local == (xmlSchemaParserCtxtPtr)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      ((xmlSchemaParserCtxtPtr)doc_local)->doc = doc;
      pxVar1 = xmlDictCreate();
      ((xmlSchemaParserCtxtPtr)doc_local)->dict = pxVar1;
      ((xmlSchemaParserCtxtPtr)doc_local)->preserve = 1;
    }
  }
  return (xmlSchemaParserCtxtPtr)doc_local;
}

Assistant:

xmlSchemaParserCtxtPtr
xmlSchemaNewDocParserCtxt(xmlDocPtr doc)
{
    xmlSchemaParserCtxtPtr ret;

    if (doc == NULL)
      return (NULL);
    ret = xmlSchemaParserCtxtCreate();
    if (ret == NULL)
	return(NULL);
    ret->doc = doc;
    ret->dict = xmlDictCreate();
    /* The application has responsibility for the document */
    ret->preserve = 1;

    return (ret);
}